

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O3

char * mpt_readline(char *prompt)

{
  char cVar1;
  char *pcVar2;
  anon_union_8_2_61bd1b83 aVar3;
  ushort **ppuVar4;
  long *plVar5;
  
  if (mpt_readline::r.fcn != (_func_char_ptr_char_ptr *)0x0) {
LAB_00101ca8:
    pcVar2 = (*mpt_readline::r.fcn)(prompt);
    aVar3 = mpt_readline::h;
    if (((pcVar2 != (char *)0x0 && mpt_readline::h.fcn != (_func_char_ptr_char_ptr *)0x0) &&
        (cVar1 = *pcVar2, (long)cVar1 != 0)) &&
       (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0)) {
      (*aVar3.fcn)(pcVar2);
    }
    return pcVar2;
  }
LAB_00101bc6:
  pcVar2 = getenv("MALLOC_TRACE");
  if (pcVar2 != (char *)0x0) {
    fputs("disabled readline support for memory tracing\n",_stderr);
    mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
    mpt_readline::r.fcn = _readline;
    pcVar2 = _readline(prompt);
    return pcVar2;
  }
  mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
  if (mpt_readline::r.fcn == (_func_char_ptr_char_ptr *)0x0) {
    mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)0x0;
    pcVar2 = "libreadline.so.7";
    plVar5 = (long *)(open_backend_backends + 8);
    do {
      lib_glob = (void *)dlopen(pcVar2,1);
      if (lib_glob != (void *)0x0) {
        aVar3.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
        if (aVar3.fcn != (_func_char_ptr_char_ptr *)0x0) goto LAB_00101c67;
        dlclose(lib_glob);
      }
      pcVar2 = (char *)*plVar5;
      plVar5 = plVar5 + 1;
      if (pcVar2 == (char *)0x0) {
        mpt_readline::r.fcn = _readline;
        mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
        goto LAB_00101ca8;
      }
    } while( true );
  }
  goto LAB_00101bf2;
LAB_00101c67:
  atexit(close_readline);
  mpt_readline::r.fcn = aVar3.fcn;
LAB_00101bf2:
  mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"add_history");
  if (mpt_readline::r.fcn != (_func_char_ptr_char_ptr *)0x0) goto LAB_00101ca8;
  goto LAB_00101bc6;
}

Assistant:

extern char *mpt_readline(const char *prompt)
{
	static union {
		char *(*fcn)(const char *);
		void *addr;
	} r = { 0 }, h;
	
	/* backend already selected */
	if (r.fcn) {
		char *ret = r.fcn(prompt);
		if (h.fcn && ret && *ret && !isspace(*ret)) {
			h.fcn(ret);
		}
		return ret;
	}
	/* no 3rd party allocations */
	if (getenv("MALLOC_TRACE")) {
		fputs("disabled readline support for memory tracing\n", stderr);
		h.addr = 0;
		return (r.fcn = _readline)(prompt);
	}
	/* use linked implementation */
	r.addr = dlsym(lib_glob, "readline");
	
	/* alternate shared lib implementation */
	if (r.addr || (r.addr = open_backend())) {
		h.addr = dlsym(lib_glob, "add_history");
	}
	/* fallback implementation */
	else {
		r.fcn = _readline;
		h.addr = 0;
	}
	/* (re)call with defined backend */
	return mpt_readline(prompt);
}